

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getUINTPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  Color *pCVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  allocator_type local_59;
  undefined8 local_58;
  undefined8 local_50;
  uint local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_00000084,c2);
  local_50 = CONCAT44(in_register_0000000c,c1);
  local_40 = (ulong)(c3 + c2);
  if (c0 + c1 + c3 + c2 != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x419,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  if ((((c0 != 0) && (c1 != 0)) && (c2 != 0)) && (c3 != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((this->super_Image).width * (this->super_Image).height) << 2,&local_59);
    uVar7 = (this->super_Image).height;
    if (uVar7 != 0) {
      local_48 = -1 << ((byte)c0 & 0x1f) ^ 0xffffffff;
      if (c0 == 0x20) {
        local_48 = 0xffffffff;
      }
      uVar5 = (uint)local_50;
      uVar2 = -1 << ((byte)local_50 & 0x1f) ^ 0xffffffff;
      if (uVar5 == 0x20) {
        uVar2 = 0xffffffff;
      }
      uVar3 = -1 << ((byte)local_58 & 0x1f) ^ 0xffffffff;
      if ((uint)local_58 == 0x20) {
        uVar3 = 0xffffffff;
      }
      local_44 = uVar5 + (int)local_40;
      uVar4 = -1 << ((byte)c3 & 0x1f) ^ 0xffffffff;
      if (c3 == 0x20) {
        uVar4 = 0xffffffff;
      }
      uVar9 = (this->super_Image).width;
      uVar6 = 0;
      do {
        uVar8 = 0;
        if (uVar9 != 0) {
          if (((0x20 < c0) || (0x20 < uVar5)) || ((0x20 < (uint)local_58 || (0x20 < c3)))) {
            local_38 = (ulong)c0;
            __assert_fail("targetBits > 0 && targetBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                          ,0x109,"uint32_t imageio::convertUINT(uint32_t, uint32_t, uint32_t)");
          }
          uVar8 = 0;
          do {
            pCVar1 = this->pixels;
            uVar10 = (ulong)(uVar9 * uVar6 + uVar8);
            *(uint *)((__return_storage_ptr__->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar10 * 4) =
                 (uint)(long)pCVar1[uVar10].field_0.comps[3] & uVar4 |
                 ((uint)(long)pCVar1[uVar10].field_0.comps[0] & local_48) << ((byte)local_44 & 0x1f)
                 | ((uint)(long)pCVar1[uVar10].field_0.comps[2] & uVar3) << ((byte)c3 & 0x1f) |
                   ((uint)(long)pCVar1[uVar10].field_0.comps[1] & uVar2) << ((byte)local_40 & 0x1f);
            uVar8 = uVar8 + 1;
            uVar9 = (this->super_Image).width;
          } while (uVar8 < uVar9);
          uVar7 = (this->super_Image).height;
          uVar8 = uVar9;
        }
        uVar9 = uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar7);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x41a,
                "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[0]), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[1]), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[2]), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[3]), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }